

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# capi_tester.hpp
# Opt level: O1

bool __thiscall duckdb::CAPITester::OpenDatabase(CAPITester *this,char *path)

{
  int iVar1;
  bool bVar2;
  
  Cleanup(this);
  iVar1 = duckdb_open(path,this);
  if (iVar1 == 0) {
    iVar1 = duckdb_connect(this->database,&this->connection);
    bVar2 = iVar1 == 0;
  }
  else {
    bVar2 = false;
  }
  return bVar2;
}

Assistant:

bool OpenDatabase(const char *path) {
		Cleanup();
		if (duckdb_open(path, &database) != DuckDBSuccess) {
			return false;
		}
		if (duckdb_connect(database, &connection) != DuckDBSuccess) {
			return false;
		}
		return true;
	}